

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp
# Opt level: O0

IterateResult __thiscall
gl4cts::DirectStateAccess::Renderbuffers::StorageErrorsTest::iterate(StorageErrorsTest *this)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  ContextType ctxType;
  ApiType requiredApiType;
  RenderContext *pRVar6;
  undefined4 extraout_var;
  ContextInfo *this_00;
  bool is_error;
  bool is_ok;
  bool is_arb_direct_state_access;
  bool is_at_least_gl_45;
  Functions *gl;
  StorageErrorsTest *this_local;
  long lVar7;
  
  pRVar6 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar5 = (*pRVar6->_vptr_RenderContext[3])();
  lVar7 = CONCAT44(extraout_var,iVar5);
  pRVar6 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  ctxType.super_ApiType.m_bits = (ApiType)(*pRVar6->_vptr_RenderContext[2])();
  requiredApiType = glu::ApiType::core(4,5);
  bVar1 = glu::contextSupports(ctxType,requiredApiType);
  this_00 = deqp::Context::getContextInfo((this->super_TestCase).m_context);
  bVar2 = glu::ContextInfo::isExtensionSupported(this_00,"GL_ARB_direct_state_access");
  if ((bVar1) || (bVar2)) {
    PrepareObjects(this);
    (**(code **)(lVar7 + 0xfa8))(this->m_rbo_invalid,0x8058,1);
    bVar1 = ExpectError(this,0x502,"NamedRenderbufferStorage",
                        "renderbuffer is not the name of an existing renderbuffer object.");
    (**(code **)(lVar7 + 0xfa8))(this->m_rbo_valid,0x8058,0xffffffff,1);
    bVar2 = ExpectError(this,0x501,"NamedRenderbufferStorage","either of width is negative.");
    (**(code **)(lVar7 + 0xfa8))(this->m_rbo_valid,0x8058,1,0xffffffff);
    bVar3 = ExpectError(this,0x501,"NamedRenderbufferStorage","either of height is negative.");
    (**(code **)(lVar7 + 0xfa8))(this->m_rbo_valid,this->m_internalformat_invalid,1);
    bVar4 = ExpectError(this,0x500,"NamedRenderbufferStorage",
                        "internalformat is not a color-renderable, depth-renderable, or stencil-renderable format (it is COMPRESSED_RED)."
                       );
    Clean(this);
    if ((bVar3 && (bVar2 && bVar1)) && bVar4) {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
                 "Pass");
    }
    else {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                 "Fail");
    }
  }
  else {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_NOT_SUPPORTED,"Not Supported");
  }
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult StorageErrorsTest::iterate()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Get context setup. */
	bool is_at_least_gl_45 = (glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(4, 5)));
	bool is_arb_direct_state_access = m_context.getContextInfo().isExtensionSupported("GL_ARB_direct_state_access");

	if ((!is_at_least_gl_45) && (!is_arb_direct_state_access))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not Supported");

		return STOP;
	}

	/* Running tests. */
	bool is_ok	= true;
	bool is_error = false;

	try
	{
		/* Prepare objects. */
		PrepareObjects();

		/*  Check that INVALID_OPERATION is generated by NamedRenderbufferStorage if
		 renderbuffer is not the name of an existing renderbuffer object. */
		gl.namedRenderbufferStorage(m_rbo_invalid, GL_RGBA8, 1, 1);

		is_ok &= ExpectError(GL_INVALID_OPERATION, "NamedRenderbufferStorage",
							 "renderbuffer is not the name of an existing renderbuffer object.");

		/*  Check that INVALID_VALUE is generated by NamedRenderbufferStorage if
		 either of width or height is negative, or greater than the value of
		 MAX_RENDERBUFFER_SIZE. */
		gl.namedRenderbufferStorage(m_rbo_valid, GL_RGBA8, -1, 1);

		is_ok &= ExpectError(GL_INVALID_VALUE, "NamedRenderbufferStorage", "either of width is negative.");

		gl.namedRenderbufferStorage(m_rbo_valid, GL_RGBA8, 1, -1);

		is_ok &= ExpectError(GL_INVALID_VALUE, "NamedRenderbufferStorage", "either of height is negative.");

		/*  Check that INVALID_ENUM is generated by NamedRenderbufferStorage if
		 internalformat is not a color-renderable, depth-renderable, or
		 stencil-renderable format. */
		gl.namedRenderbufferStorage(m_rbo_valid, m_internalformat_invalid, 1, 1);

		is_ok &= ExpectError(GL_INVALID_ENUM, "NamedRenderbufferStorage", "internalformat is not a color-renderable, "
																		  "depth-renderable, or stencil-renderable "
																		  "format (it is COMPRESSED_RED).");
	}
	catch (...)
	{
		is_ok	= false;
		is_error = true;
	}

	/* Cleanup. */
	Clean();

	/* Result's setup. */
	if (is_ok)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		if (is_error)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_INTERNAL_ERROR, "Error");
		}
		else
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		}
	}

	return STOP;
}